

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Skip(CopyingInputStreamAdaptor *this,int count)

{
  int v1;
  int v2;
  uint uVar1;
  LogMessage *pLVar2;
  undefined1 auVar3 [16];
  int skipped;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  string *local_28;
  string *absl_log_internal_check_op_result;
  CopyingInputStreamAdaptor *pCStack_18;
  int count_local;
  CopyingInputStreamAdaptor *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pCStack_18 = this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue(count);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_28 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(v1,v2,"count >= 0");
  if (local_28 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xf0,auVar3._0_8_,auVar3._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  if ((this->failed_ & 1U) == 0) {
    if (this->backup_bytes_ < (int)absl_log_internal_check_op_result._4_4_) {
      absl_log_internal_check_op_result._4_4_ =
           absl_log_internal_check_op_result._4_4_ - this->backup_bytes_;
      this->backup_bytes_ = 0;
      uVar1 = (*this->copying_stream_->_vptr_CopyingInputStream[3])
                        (this->copying_stream_,(ulong)absl_log_internal_check_op_result._4_4_);
      this->position_ = (long)(int)uVar1 + this->position_;
      this_local._7_1_ = uVar1 == absl_log_internal_check_op_result._4_4_;
    }
    else {
      this->backup_bytes_ = this->backup_bytes_ - absl_log_internal_check_op_result._4_4_;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CopyingInputStreamAdaptor::Skip(int count) {
  ABSL_CHECK_GE(count, 0);

  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  // First skip any bytes left over from a previous BackUp().
  if (backup_bytes_ >= count) {
    // We have more data left over than we're trying to skip.  Just chop it.
    backup_bytes_ -= count;
    return true;
  }

  count -= backup_bytes_;
  backup_bytes_ = 0;

  int skipped = copying_stream_->Skip(count);
  position_ += skipped;
  return skipped == count;
}